

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::anon_unknown_24::DescriptorsByNameEq<google::protobuf::FileDescriptor>::operator()
          (DescriptorsByNameEq<google::protobuf::FileDescriptor> *this,FileDescriptor *lhs,
          FileDescriptor *rhs)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  
  if ((FileDescriptor *)this != lhs) {
    __y._M_str = (lhs->name_->_M_dataplus)._M_p;
    __y._M_len = lhs->name_->_M_string_length;
    __x._M_str = (char *)**(undefined8 **)(this + 8);
    __x._M_len = (*(undefined8 **)(this + 8))[1];
    bVar1 = std::operator==(__x,__y);
    return bVar1;
  }
  return true;
}

Assistant:

bool operator()(const DescriptorT* lhs, const DescriptorT* rhs) const {
    return lhs == rhs || lhs->name() == rhs->name();
  }